

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O2

xml_output * attrTagX(xml_output *__return_storage_ptr__,char *name,QStringList *v,char *s)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QString> local_58;
  char *name_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (v->d).size;
  name_local = name;
  if (lVar1 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      noxml();
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.d = (v->d).d;
    local_58.ptr = (v->d).ptr;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.size = lVar1;
    QString::QString((QString *)&local_88,"%(%1)");
    QString::arg<const_char_*,_true>
              ((QString *)&local_70,(QString *)&local_88,&name_local,0,(QChar)0x20);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QString::QString((QString *)&local_70,name_local);
    QString::QString((QString *)&local_a0,s);
    QListSpecialMethods<QString>::join
              ((QString *)&local_88,(QListSpecialMethods<QString> *)&local_58,(QString *)&local_a0);
    tagValue(__return_storage_ptr__,(QString *)&local_70,(QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrTagX(const char *name, const QStringList &v, const char *s = ",")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(name));
    return tagValue(name, temp.join(s));
}